

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::restoreInitialBasis
          (SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SPxId *pSVar1;
  Status SVar2;
  SPxStatus SVar3;
  undefined8 in_RAX;
  SPxOut *pSVar4;
  DataKey DVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *theLP;
  int i;
  long lVar6;
  Verbosity old_verbosity;
  undefined8 local_18;
  
  pSVar4 = this->spxout;
  local_18 = in_RAX;
  if ((pSVar4 != (SPxOut *)0x0) && (4 < (int)pSVar4->m_verbosity)) {
    local_18 = CONCAT44(pSVar4->m_verbosity,5);
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<(this->spxout,"ICHBAS10 setup slack basis");
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_18 + 4);
  }
  theLP = this->theLP;
  if (theLP->theRep == COLUMN) {
    for (lVar6 = 0;
        lVar6 < (theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar6 = lVar6 + 1) {
      SVar2 = dualRowStatus(this,(int)lVar6);
      (this->thedesc).rowstat.data[lVar6] = SVar2;
      DVar5 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::rId(&this->theLP->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(int)lVar6);
      pSVar1 = (this->theBaseId).data;
      pSVar1[lVar6].super_DataKey = DVar5;
      pSVar1[lVar6].super_DataKey.info = -1;
      theLP = this->theLP;
    }
    for (lVar6 = 0;
        lVar6 < (theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar6 = lVar6 + 1) {
      SVar2 = primalColStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((int)lVar6,
                         &theLP->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
      (this->thedesc).colstat.data[lVar6] = SVar2;
      theLP = this->theLP;
    }
  }
  else {
    for (lVar6 = 0;
        lVar6 < (theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar6 = lVar6 + 1) {
      SVar2 = dualRowStatus(this,(int)lVar6);
      (this->thedesc).rowstat.data[lVar6] = SVar2;
      theLP = this->theLP;
    }
    for (lVar6 = 0;
        lVar6 < (theLP->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; lVar6 = lVar6 + 1) {
      SVar2 = primalColStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((int)lVar6,
                         &theLP->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
      (this->thedesc).colstat.data[lVar6] = SVar2;
      DVar5 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::cId(&this->theLP->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(int)lVar6);
      pSVar1 = (this->theBaseId).data;
      pSVar1[lVar6].super_DataKey = DVar5;
      pSVar1[lVar6].super_DataKey.info = 1;
      theLP = this->theLP;
    }
  }
  SVar3 = this->thestatus;
  if (NO_PROBLEM < SVar3) {
    if (this->matrixIsSetup == true) {
      loadMatrixVecs(this);
      SVar3 = this->thestatus;
    }
    if (SVar3 == REGULAR) {
      return;
    }
  }
  this->thestatus = REGULAR;
  return;
}

Assistant:

void SPxBasisBase<R>::restoreInitialBasis()
{
   assert(!factorized);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ICHBAS10 setup slack basis" << std::endl;)

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(int i = 0; i < theLP->nRows(); ++i)
      {
         thedesc.rowStatus(i) = dualRowStatus(i);
         baseId(i) = theLP->SPxLPBase<R>::rId(i);
      }

      for(int i = 0; i < theLP->nCols(); ++i)
         thedesc.colStatus(i) = primalColStatus(i, theLP);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);

      for(int i = 0; i < theLP->nRows(); ++i)
         thedesc.rowStatus(i) = dualRowStatus(i);

      for(int i = 0; i < theLP->nCols(); ++i)
      {
         thedesc.colStatus(i) = primalColStatus(i, theLP);
         baseId(i) = theLP->SPxLPBase<R>::cId(i);
      }
   }

   /* if matrix was set up, load new basis vectors to the matrix */
   if(status() > NO_PROBLEM && matrixIsSetup)
      loadMatrixVecs();

   /* update basis status */
   setStatus(REGULAR);
}